

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O2

NumToEntryTable * __thiscall
google::protobuf::internal::anon_unknown_36::MakeNumToEntryTable
          (NumToEntryTable *__return_storage_ptr__,anon_unknown_36 *this,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields)

{
  int iVar1;
  pointer pSVar2;
  bool bVar3;
  bool bVar4;
  reference pFVar5;
  Nullable<const_char_*> failure_msg;
  uint uVar6;
  ulong i;
  ulong uVar7;
  uint32_t uVar8;
  pointer pSVar9;
  uint local_74;
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  *local_70;
  pointer local_68;
  SkipEntryBlock local_60;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields_local;
  
  local_68 = ordered_fields.ptr_;
  local_70 = &__return_storage_ptr__->blocks;
  (__return_storage_ptr__->blocks).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->blocks).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->blocks).
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->skipmap32 = 0xffffffff;
  i = 0;
  uVar8 = 0xffffffff;
  ordered_fields_local.ptr_ = (pointer)this;
  ordered_fields_local.len_ = (size_type)local_68;
  while( true ) {
    if ((ushort)ordered_fields.ptr_ == i) {
      return __return_storage_ptr__;
    }
    pFVar5 = absl::lts_20250127::
             Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::operator[]
                       (&ordered_fields_local,i);
    iVar1 = pFVar5->field->number_;
    if (0x20 < iVar1) break;
    uVar8 = uVar8 + (-1 << ((char)iVar1 - 1U & 0x1f));
    __return_storage_ptr__->skipmap32 = uVar8;
    i = i + 1;
  }
  uVar6 = 0;
  pSVar9 = (pointer)0x0;
  bVar4 = true;
  while( true ) {
    if ((short)i == (short)local_68) {
      return __return_storage_ptr__;
    }
    pFVar5 = absl::lts_20250127::
             Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::operator[]
                       (&ordered_fields_local,i & 0xffff);
    uVar8 = pFVar5->field->number_;
    local_74 = uVar6;
    local_60.first_fnum = uVar8;
    failure_msg = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                            (&local_60.first_fnum,&local_74,"fnum > last_skip_entry_start");
    if (failure_msg != (Nullable<const_char_*>)0x0) break;
    bVar3 = bVar4;
    if (0x60 < uVar8 - uVar6) {
      bVar3 = true;
    }
    if (bVar4) {
      bVar3 = bVar4;
    }
    if (bVar3) {
      local_60.entries.
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_60.entries.
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_60.entries.
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_60.first_fnum = uVar8;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
      ::emplace_back<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>
                (local_70,&local_60);
      std::
      _Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
      ::~_Vector_base(&local_60.entries.
                       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                     );
      pSVar9 = (__return_storage_ptr__->blocks).
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      bVar3 = false;
    }
    uVar6 = uVar8 - pSVar9->first_fnum;
    uVar7 = (ulong)(uVar6 >> 4);
    uVar6 = uVar6 & 0xf;
    while (pSVar2 = (pSVar9->entries).
                    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          (ulong)((long)(pSVar9->entries).
                        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 2) <= uVar7) {
      local_60.first_fnum = CONCAT22((short)i,0xffff);
      std::
      vector<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
      ::emplace_back<google::protobuf::internal::TailCallTableInfo::SkipEntry16>
                (&pSVar9->entries,(SkipEntry16 *)&local_60);
    }
    pSVar2 = pSVar2 + uVar7;
    pSVar2->skipmap = pSVar2->skipmap + (short)(-1 << (sbyte)uVar6);
    uVar6 = uVar8 - uVar6;
    i = (ulong)((int)i + 1);
    bVar4 = bVar3;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
             ,0x1e9,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
}

Assistant:

TailCallTableInfo::NumToEntryTable MakeNumToEntryTable(
    absl::Span<const TailCallTableInfo::FieldOptions> ordered_fields) {
  TailCallTableInfo::NumToEntryTable num_to_entry_table;
  num_to_entry_table.skipmap32 = static_cast<uint32_t>(-1);

  // skip_entry_block is the current block of SkipEntries that we're
  // appending to.  cur_block_first_fnum is the number of the first
  // field represented by the block.
  uint16_t field_entry_index = 0;
  uint16_t N = ordered_fields.size();
  // First, handle field numbers 1-32, which affect only the initial
  // skipmap32 and don't generate additional skip-entry blocks.
  for (; field_entry_index != N; ++field_entry_index) {
    auto* field_descriptor = ordered_fields[field_entry_index].field;
    if (field_descriptor->number() > 32) break;
    auto skipmap32_index = field_descriptor->number() - 1;
    num_to_entry_table.skipmap32 -= 1 << skipmap32_index;
  }
  // If all the field numbers were less than or equal to 32, we will have
  // no further entries to process, and we are already done.
  if (field_entry_index == N) return num_to_entry_table;

  TailCallTableInfo::SkipEntryBlock* block = nullptr;
  bool start_new_block = true;
  // To determine sparseness, track the field number corresponding to
  // the start of the most recent skip entry.
  uint32_t last_skip_entry_start = 0;
  for (; field_entry_index != N; ++field_entry_index) {
    auto* field_descriptor = ordered_fields[field_entry_index].field;
    uint32_t fnum = static_cast<uint32_t>(field_descriptor->number());
    ABSL_CHECK_GT(fnum, last_skip_entry_start);
    if (start_new_block == false) {
      // If the next field number is within 15 of the last_skip_entry_start, we
      // continue writing just to that entry.  If it's between 16 and 31 more,
      // then we just extend the current block by one. If it's more than 31
      // more, we have to add empty skip entries in order to continue using the
      // existing block.  Obviously it's just 32 more, it doesn't make sense to
      // start a whole new block, since new blocks mean having to write out
      // their starting field number, which is 32 bits, as well as the size of
      // the additional block, which is 16... while an empty SkipEntry16 only
      // costs 32 bits.  So if it was 48 more, it's a slight space win; we save
      // 16 bits, but probably at the cost of slower run time.  We're choosing
      // 96 for now.
      if (fnum - last_skip_entry_start > 96) start_new_block = true;
    }
    if (start_new_block) {
      num_to_entry_table.blocks.push_back({fnum});
      block = &num_to_entry_table.blocks.back();
      start_new_block = false;
    }

    auto skip_entry_num = (fnum - block->first_fnum) / 16;
    auto skip_entry_index = (fnum - block->first_fnum) % 16;
    while (skip_entry_num >= block->entries.size())
      block->entries.push_back({0xFFFF, field_entry_index});
    block->entries[skip_entry_num].skipmap -= 1 << (skip_entry_index);

    last_skip_entry_start = fnum - skip_entry_index;
  }
  return num_to_entry_table;
}